

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_nuc5.c
# Opt level: O0

mraa_board_t * mraa_intel_nuc5(void)

{
  mraa_board_t *__ptr;
  mraa_adv_func_t *pmVar1;
  mraa_pininfo_t *pmVar2;
  int local_68;
  int local_64;
  int i;
  int i2c_num;
  mraa_pincapabilities_t local_58;
  mraa_pincapabilities_t local_54;
  mraa_pincapabilities_t local_50;
  mraa_pincapabilities_t local_4c;
  mraa_pincapabilities_t local_48;
  mraa_pincapabilities_t local_44;
  mraa_pincapabilities_t local_40;
  mraa_pincapabilities_t local_3c;
  mraa_pincapabilities_t local_38;
  mraa_pincapabilities_t local_34;
  mraa_pincapabilities_t local_30;
  mraa_pincapabilities_t local_2c;
  mraa_pincapabilities_t local_28;
  mraa_pincapabilities_t local_24;
  mraa_pincapabilities_t local_20;
  mraa_pincapabilities_t local_1c;
  mraa_board_t *b;
  
  __ptr = (mraa_board_t *)calloc(1,0x5f0);
  if (__ptr != (mraa_board_t *)0x0) {
    __ptr->platform_name = "Intel NUC5";
    __ptr->phy_pin_count = 0x12;
    pmVar1 = (mraa_adv_func_t *)calloc(1,0x288);
    __ptr->adv_func = pmVar1;
    if (__ptr->adv_func != (mraa_adv_func_t *)0x0) {
      pmVar2 = (mraa_pininfo_t *)calloc(0x12,0x2f4);
      __ptr->pins = pmVar2;
      if (__ptr->pins != (mraa_pininfo_t *)0x0) {
        strncpy(__ptr->pins->name,"1.8v",8);
        local_1c._0_1_ = 1;
        __ptr->pins->capabilities = local_1c;
        strncpy(__ptr->pins[1].name,"GND",8);
        local_20._0_1_ = 1;
        __ptr->pins[1].capabilities = local_20;
        strncpy(__ptr->pins[2].name,"HDMIcec",8);
        local_24._0_1_ = 1;
        __ptr->pins[2].capabilities = local_24;
        strncpy(__ptr->pins[3].name,"DMICclk",8);
        local_28._0_1_ = 1;
        __ptr->pins[3].capabilities = local_28;
        strncpy(__ptr->pins[4].name,"3.3v",8);
        local_2c._0_1_ = 1;
        __ptr->pins[4].capabilities = local_2c;
        strncpy(__ptr->pins[5].name,"DMICda",8);
        local_30._0_1_ = 1;
        __ptr->pins[5].capabilities = local_30;
        strncpy(__ptr->pins[6].name,"Key",8);
        local_34._0_1_ = 1;
        __ptr->pins[6].capabilities = local_34;
        strncpy(__ptr->pins[7].name,"SMB-A",8);
        local_38._0_1_ = 1;
        __ptr->pins[7].capabilities = local_38;
        strncpy(__ptr->pins[8].name,"5v",8);
        local_3c._0_1_ = 1;
        __ptr->pins[8].capabilities = local_3c;
        strncpy(__ptr->pins[9].name,"SCI",8);
        local_40._0_1_ = 1;
        __ptr->pins[9].capabilities = local_40;
        strncpy(__ptr->pins[10].name,"PWM0",8);
        local_44._0_1_ = 1;
        __ptr->pins[10].capabilities = local_44;
        __ptr->pins[10].pwm.pinmap = 0;
        __ptr->pins[10].pwm.parent_id = 0;
        __ptr->pins[10].pwm.mux_total = 0;
        strncpy(__ptr->pins[0xb].name,"PWM1",8);
        local_48._0_1_ = 1;
        __ptr->pins[0xb].capabilities = local_48;
        __ptr->pins[0xb].pwm.pinmap = 0;
        __ptr->pins[0xb].pwm.parent_id = 1;
        __ptr->pins[0xb].pwm.mux_total = 0;
        strncpy(__ptr->pins[0xc].name,"I2C0SCL",8);
        local_4c._0_1_ = 0x21;
        __ptr->pins[0xc].capabilities = local_4c;
        __ptr->pins[0xc].i2c.pinmap = 1;
        __ptr->pins[0xc].i2c.mux_total = 0;
        strncpy(__ptr->pins[0xd].name,"I2C0SDA",8);
        local_50._0_1_ = 0x21;
        __ptr->pins[0xd].capabilities = local_50;
        __ptr->pins[0xd].i2c.pinmap = 1;
        __ptr->pins[0xd].i2c.mux_total = 0;
        strncpy(__ptr->pins[0xe].name,"I2C1SCL",8);
        local_54._0_1_ = 0x21;
        __ptr->pins[0xe].capabilities = local_54;
        __ptr->pins[0xe].i2c.pinmap = 1;
        __ptr->pins[0xe].i2c.mux_total = 0;
        strncpy(__ptr->pins[0xf].name,"I2C1SDA",8);
        local_58._0_1_ = 0x21;
        __ptr->pins[0xf].capabilities = local_58;
        __ptr->pins[0xf].i2c.pinmap = 1;
        __ptr->pins[0xf].i2c.mux_total = 0;
        strncpy(__ptr->pins[0x10].name,"SMB_CLK",8);
        i2c_num = CONCAT31(i2c_num._1_3_,1);
        __ptr->pins[0x10].capabilities = (mraa_pincapabilities_t)i2c_num;
        strncpy(__ptr->pins[0x11].name,"SMB_SDA",8);
        i = CONCAT31(i._1_3_,1);
        __ptr->pins[0x11].capabilities = (mraa_pincapabilities_t)i;
        __ptr->i2c_bus_count = 0;
        local_64 = -1;
        local_68 = 0;
        while ((local_68 < 2 &&
               (local_64 = mraa_find_i2c_bus("designware",local_64 + 1), local_64 != -1))) {
          __ptr->i2c_bus_count = __ptr->i2c_bus_count + 1;
          __ptr->i2c_bus[local_68].bus_id = local_64;
          __ptr->i2c_bus[local_68].sda = local_68 * 2 + 0xc;
          __ptr->i2c_bus[local_68].scl = local_68 * 2 + 0xd;
          local_68 = local_68 + 1;
        }
        if (0 < __ptr->i2c_bus_count) {
          __ptr->def_i2c_bus = __ptr->i2c_bus[0].bus_id;
          return __ptr;
        }
        return __ptr;
      }
      free(__ptr->adv_func);
    }
    syslog(2,"nuc5: Platform failed to initialise");
    free(__ptr);
  }
  return (mraa_board_t *)0x0;
}

Assistant:

mraa_board_t*
mraa_intel_nuc5()
{
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof(mraa_board_t));
    if (b == NULL) {
        return NULL;
    }

    b->platform_name = PLATFORM_NAME;
    b->phy_pin_count = MRAA_INTEL_NUC5_PINCOUNT;

    b->adv_func = (mraa_adv_func_t*) calloc(1, sizeof(mraa_adv_func_t));
    if (b->adv_func == NULL) {
        goto error;
    }

    b->pins = (mraa_pininfo_t*) calloc(MRAA_INTEL_NUC5_PINCOUNT,sizeof(mraa_pininfo_t));
    if (b->pins == NULL) {
        free(b->adv_func);
        goto error;
    }

    strncpy(b->pins[0].name, "1.8v", 8);
    b->pins[0].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };

    strncpy(b->pins[1].name, "GND", 8);
    b->pins[1].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[2].name, "HDMIcec", 8);
    b->pins[2].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[3].name, "DMICclk", 8);
    b->pins[3].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[4].name, "3.3v", 8);
    b->pins[4].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[5].name, "DMICda", 8);
    b->pins[5].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[6].name, "Key", 8);
    b->pins[6].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[7].name, "SMB-A", 8);
    b->pins[7].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[8].name, "5v", 8);
    b->pins[8].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[9].name, "SCI", 8);
    b->pins[9].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };

    strncpy(b->pins[10].name, "PWM0", 8);
    b->pins[10].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    b->pins[10].pwm.pinmap = 0;
    b->pins[10].pwm.parent_id = 0;
    b->pins[10].pwm.mux_total = 0;

    strncpy(b->pins[11].name, "PWM1", 8);
    b->pins[11].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    b->pins[11].pwm.pinmap = 0;
    b->pins[11].pwm.parent_id = 1;
    b->pins[11].pwm.mux_total = 0;

    strncpy(b->pins[12].name, "I2C0SCL", 8);
    b->pins[12].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 };
    b->pins[12].i2c.pinmap = 1;
    b->pins[12].i2c.mux_total = 0;

    strncpy(b->pins[13].name, "I2C0SDA", 8);
    b->pins[13].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 };
    b->pins[13].i2c.pinmap = 1;
    b->pins[13].i2c.mux_total = 0;

    strncpy(b->pins[14].name, "I2C1SCL", 8);
    b->pins[14].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 };
    b->pins[14].i2c.pinmap = 1;
    b->pins[14].i2c.mux_total = 0;

    strncpy(b->pins[15].name, "I2C1SDA", 8);
    b->pins[15].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 };
    b->pins[15].i2c.pinmap = 1;
    b->pins[15].i2c.mux_total = 0;

    strncpy(b->pins[16].name, "SMB_CLK", 8);
    b->pins[16].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[17].name, "SMB_SDA", 8);
    b->pins[17].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };

    b->i2c_bus_count = 0;
    int i2c_num = -1;
    int i;
    for (i = 0; i < 2; i++) {
        i2c_num = mraa_find_i2c_bus(I2CNAME, i2c_num + 1);
        if (i2c_num == -1) {
            break;
        }
        b->i2c_bus_count++;
        b->i2c_bus[i].bus_id = i2c_num;
        b->i2c_bus[i].sda = 12 + (i*2);
        b->i2c_bus[i].scl = 13 + (i*2);
    }

    if (b->i2c_bus_count > 0) {
        b->def_i2c_bus = b->i2c_bus[0].bus_id;
    }

    return b;
error:
    syslog(LOG_CRIT, "nuc5: Platform failed to initialise");
    free(b);
    return NULL;
}